

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O2

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
          (SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *this,DWARFDie *V)

{
  uint uVar1;
  VIterator pDVar2;
  reference __v;
  pair<llvm::NoneType,_bool> pVar3;
  pair<std::_Rb_tree_iterator<llvm::DWARFDie>,_bool> pVar4;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    pDVar2 = vfind(this,V);
    uVar1 = (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
    if (pDVar2 == (VIterator)
                  ((ulong)uVar1 * 0x10 +
                  (long)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                        super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                        super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.
                        BeginX)) {
      pVar3.first = None;
      pVar3.second = true;
      pVar3._5_3_ = 0;
      if (uVar1 < 3) {
        SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)this,V);
      }
      else {
        uVar1 = 1;
        while (uVar1 != 0) {
          __v = SmallVectorTemplateCommon<llvm::DWARFDie,_void>::back
                          ((SmallVectorTemplateCommon<llvm::DWARFDie,_void> *)this);
          std::
          _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
          ::_M_insert_unique<llvm::DWARFDie_const&>
                    ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                      *)&this->Set,__v);
          SmallVectorTemplateBase<llvm::DWARFDie,_true>::pop_back
                    ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)this);
          uVar1 = (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                  super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                  super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
        }
        std::
        _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
        ::_M_insert_unique<llvm::DWARFDie_const&>
                  ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                    *)&this->Set,V);
      }
    }
    else {
      pVar3.first = None;
      pVar3.second = false;
      pVar3._5_3_ = 0;
    }
  }
  else {
    pVar4 = std::
            _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
            ::_M_insert_unique<llvm::DWARFDie_const&>
                      ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                        *)&this->Set,V);
    pVar3 = (pair<llvm::NoneType,_bool>)(((ulong)pVar4.second << 0x20) + 1);
  }
  return pVar3;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }